

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O1

size_t curlToMemCallback(void *buffer,size_t size,size_t nmemb,void *userp)

{
  long lVar1;
  void *pvVar2;
  size_t __size;
  
  __size = size * nmemb;
  if (*(long *)((long)userp + 8) == 0) {
    pvVar2 = malloc(__size);
  }
  else {
    pvVar2 = realloc(*userp,*(long *)((long)userp + 8) + __size);
  }
  *(void **)userp = pvVar2;
  if (pvVar2 == (void *)0x0) {
    ffpmsg("realloc error - not enough memory (curlToMemCallback)\n");
    __size = 0;
  }
  else {
    lVar1 = *(long *)((long)userp + 8);
    memcpy((void *)((long)pvVar2 + lVar1),buffer,__size);
    *(size_t *)((long)userp + 8) = lVar1 + __size;
  }
  return __size;
}

Assistant:

size_t curlToMemCallback(void *buffer, size_t size, size_t nmemb, void *userp)
{
   curlmembuf* inmem = (curlmembuf* )userp;
   size_t transferSize = size*nmemb;
   if (!inmem->size)
   {
      /* First time through - initialize with malloc */
      inmem->memory = (char *)malloc(transferSize); 
   }
   else
      inmem->memory = realloc(inmem->memory, inmem->size+transferSize);
   if (inmem->memory == NULL)
   {
      ffpmsg("realloc error - not enough memory (curlToMemCallback)\n");
      return 0;
   }
   memcpy(&(inmem->memory[inmem->size]), buffer, transferSize);
   inmem->size += transferSize;
   
   return transferSize;
}